

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNsPtr * xmlGetNsList(xmlDoc *doc,xmlNode *node)

{
  int iVar1;
  xmlNsPtr *ppxVar2;
  ulong uVar3;
  xmlNsPtr pxVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  
  if ((node == (xmlNode *)0x0) || (uVar7 = 0, node->type == XML_NAMESPACE_DECL)) {
LAB_00182707:
    ppxVar2 = (xmlNsPtr *)0x0;
  }
  else {
    iVar6 = 10;
    ppxVar2 = (xmlNsPtr *)0x0;
    for (; node != (xmlNode *)0x0; node = node->parent) {
      if (node->type == XML_ELEMENT_NODE) {
        pxVar4 = (xmlNsPtr)&node->nsDef;
LAB_00182632:
        pxVar4 = pxVar4->next;
        if (pxVar4 != (xmlNsPtr)0x0) {
          if (ppxVar2 == (xmlNsPtr *)0x0) {
            ppxVar2 = (xmlNsPtr *)(*xmlMalloc)((long)iVar6 * 8 + 8);
            if (ppxVar2 == (xmlNsPtr *)0x0) {
LAB_001826fb:
              xmlTreeErrMemory("getting namespace list");
              goto LAB_00182707;
            }
            ppxVar2[(int)uVar7] = (xmlNsPtr)0x0;
          }
          uVar3 = 0;
          if (0 < (int)uVar7) {
            uVar3 = (ulong)uVar7;
          }
          uVar5 = 0;
          do {
            if (uVar3 == uVar5) {
              if (iVar6 <= (int)uVar7) {
                ppxVar2 = (xmlNsPtr *)(*xmlRealloc)(ppxVar2,(long)(iVar6 * 2 + 1) << 3);
                if (ppxVar2 == (xmlNsPtr *)0x0) goto LAB_001826fb;
                iVar6 = iVar6 * 2;
              }
              ppxVar2[(int)uVar7] = pxVar4;
              ppxVar2[(long)(int)uVar7 + 1] = (xmlNsPtr)0x0;
              uVar7 = uVar7 + 1;
              break;
            }
            if (pxVar4->prefix == ppxVar2[uVar5]->prefix) break;
            iVar1 = xmlStrEqual(pxVar4->prefix,ppxVar2[uVar5]->prefix);
            uVar5 = uVar5 + 1;
          } while (iVar1 == 0);
          goto LAB_00182632;
        }
      }
    }
  }
  return ppxVar2;
}

Assistant:

xmlNsPtr *
xmlGetNsList(const xmlDoc *doc ATTRIBUTE_UNUSED, const xmlNode *node)
{
    xmlNsPtr cur;
    xmlNsPtr *ret = NULL;
    int nbns = 0;
    int maxns = 10;
    int i;

    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL))
        return(NULL);

    while (node != NULL) {
        if (node->type == XML_ELEMENT_NODE) {
            cur = node->nsDef;
            while (cur != NULL) {
                if (ret == NULL) {
                    ret =
                        (xmlNsPtr *) xmlMalloc((maxns + 1) *
                                               sizeof(xmlNsPtr));
                    if (ret == NULL) {
			xmlTreeErrMemory("getting namespace list");
                        return (NULL);
                    }
                    ret[nbns] = NULL;
                }
                for (i = 0; i < nbns; i++) {
                    if ((cur->prefix == ret[i]->prefix) ||
                        (xmlStrEqual(cur->prefix, ret[i]->prefix)))
                        break;
                }
                if (i >= nbns) {
                    if (nbns >= maxns) {
                        maxns *= 2;
                        ret = (xmlNsPtr *) xmlRealloc(ret,
                                                      (maxns +
                                                       1) *
                                                      sizeof(xmlNsPtr));
                        if (ret == NULL) {
			    xmlTreeErrMemory("getting namespace list");
                            return (NULL);
                        }
                    }
                    ret[nbns++] = cur;
                    ret[nbns] = NULL;
                }

                cur = cur->next;
            }
        }
        node = node->parent;
    }
    return (ret);
}